

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidgetPrivate::setup(QTableWidgetPrivate *this)

{
  QAbstractItemView *this_00;
  QItemSelectionModel *pQVar1;
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Object local_58 [8];
  Object local_50 [8];
  Object local_48 [8];
  Object local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.
              super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  type = (ConnectionType)this;
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_88,(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::pressed,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_88 + 8),(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::clicked,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_78,(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::doubleClicked,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_78 + 8),(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::activated,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemView::*)(QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)local_68,(offset_in_QAbstractItemView_to_subr)this_00,
             (Object *)QAbstractItemView::entered,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTableWidgetPrivate::*)(QModelIndex_const&)>
            ((Object *)(local_68 + 8),
             (offset_in_QAbstractItemModel_to_subr)
             (this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  pQVar1 = QAbstractItemView::selectionModel(this_00);
  QObjectPrivate::
  connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QTableWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (local_58,(offset_in_QItemSelectionModel_to_subr)pQVar1,
             (Object *)QItemSelectionModel::currentChanged,0,type);
  pQVar1 = QAbstractItemView::selectionModel(this_00);
  QObject::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QTableWidget::*)()>
            (local_50,(offset_in_QItemSelectionModel_to_subr)pQVar1,
             (ContextType *)QItemSelectionModel::selectionChanged,
             (offset_in_QTableWidget_to_subr *)0x0,(ConnectionType)this_00);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QTableWidgetPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
            (local_48,(offset_in_QAbstractItemModel_to_subr)
                      (this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model,
             (Object *)QAbstractItemModel::dataChanged,0,type);
  QObjectPrivate::
  connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QTableWidgetPrivate::*)()>
            (local_40,(offset_in_QAbstractItemModel_to_subr)
                      (this->super_QTableViewPrivate).super_QAbstractItemViewPrivate.model,
             (Object *)QAbstractItemModel::columnsRemoved,0,type);
  std::array<QMetaObject::Connection,_10UL>::operator=
            (&this->connections,(array<QMetaObject::Connection,_10UL> *)local_88);
  std::array<QMetaObject::Connection,_10UL>::~array
            ((array<QMetaObject::Connection,_10UL> *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidgetPrivate::setup()
{
    Q_Q(QTableWidget);
    connections = {
        // view signals
        QObjectPrivate::connect(q, &QTableWidget::pressed,
                                this, &QTableWidgetPrivate::emitItemPressed),
        QObjectPrivate::connect(q, &QTableWidget::clicked,
                                this, &QTableWidgetPrivate::emitItemClicked),
        QObjectPrivate::connect(q, &QTableWidget::doubleClicked,
                                this, &QTableWidgetPrivate::emitItemDoubleClicked),
        QObjectPrivate::connect(q, &QTableWidget::activated,
                                this, &QTableWidgetPrivate::emitItemActivated),
        QObjectPrivate::connect(q, &QTableWidget::entered,
                                this, &QTableWidgetPrivate::emitItemEntered),
        // model signals
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QTableWidgetPrivate::emitItemChanged),
        // selection signals
        QObjectPrivate::connect(q->selectionModel(), &QItemSelectionModel::currentChanged,
                                this, &QTableWidgetPrivate::emitCurrentItemChanged),
        QObject::connect(q->selectionModel(), &QItemSelectionModel::selectionChanged,
                         q, &QTableWidget::itemSelectionChanged),
        // sorting
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QTableWidgetPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::columnsRemoved,
                                this, &QTableWidgetPrivate::sort)
    };
}